

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddPchDependencies(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmTarget *pcVar2;
  cmMakefile *pcVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  cmGeneratorTarget *pcVar4;
  undefined8 uVar5;
  pointer ppcVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  TargetType TVar11;
  cmGlobalGenerator *pcVar12;
  const_iterator pvVar13;
  iterator __first;
  iterator __last;
  difference_type dVar14;
  ulong uVar15;
  reference arch_00;
  reference ppcVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  ostream *poVar19;
  string *psVar20;
  string_view source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fb8;
  bool local_f46;
  bool local_f44;
  bool local_f43;
  bool local_e5a;
  string local_d80;
  undefined1 local_d60 [8];
  ostringstream msg;
  undefined1 local_be8 [8];
  string err;
  cmSourceFile *pchHeader_sf;
  allocator<char> local_bb1;
  string local_bb0;
  optional<cmListFileBacktrace> local_b88;
  cmAlphaNum local_b70;
  cmAlphaNum local_b40;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  optional<cmListFileBacktrace> local_ac0;
  string_view local_aa8;
  string local_a98;
  cmAlphaNum local_a78;
  cmAlphaNum local_a48;
  string local_a18;
  cmAlphaNum local_9f8;
  cmAlphaNum local_9c8;
  string local_998;
  allocator<char> local_971;
  undefined1 local_970 [8];
  string linkerProperty;
  string pchSourceObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  iterator local_900;
  size_type local_8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8d4;
  undefined1 local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  string local_8a8 [32];
  iterator local_888;
  size_type local_880;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_878;
  allocator<char> local_859;
  string local_858;
  bool local_831;
  undefined1 local_830 [7];
  bool msvc2008OrLess;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  undefined1 local_800 [6];
  bool programDatabaseDebugInfo;
  bool editAndContinueDebugInfo;
  cmAlphaNum local_7d0;
  string local_7a0;
  string local_780 [8];
  string langFlags;
  cmAlphaNum local_730;
  string local_700;
  undefined1 local_6e0 [8];
  string compilerVersion;
  cmAlphaNum local_690;
  string local_660;
  undefined1 local_640 [8];
  string compilerId;
  string local_618;
  cmGeneratorTarget *local_5f8;
  cmGeneratorTarget *reuseTarget;
  cmAlphaNum local_5c0;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  undefined1 local_520 [8];
  string pchFile;
  cmSourceFile *pch_sf;
  string local_4f0;
  cmValue local_4d0;
  cmValue ReuseFrom;
  string local_4c0;
  cmValue local_4a0;
  cmValue pchExtension;
  string local_490;
  _Self local_470;
  _Self local_468;
  undefined1 local_460 [8];
  string sourceLanguage;
  cmSourceFile *sf;
  iterator __end6;
  iterator __begin6;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range6;
  string pchHeader_2;
  string pchSource;
  string *arch_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  optional<cmListFileBacktrace> local_3b8;
  cmAlphaNum local_3a0;
  cmAlphaNum local_370;
  string local_340;
  cmAlphaNum local_320;
  cmAlphaNum local_2f0;
  string local_2c0;
  cmAlphaNum local_2a0;
  cmAlphaNum local_270;
  string local_240;
  undefined1 local_220 [8];
  string pchHeader_1;
  string *arch;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string useMultiArchPch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  difference_type langSources;
  string *lang_1;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *__range2;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string pchHeader;
  string *lang;
  const_iterator __end3;
  const_iterator __begin3;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchLangSet;
  undefined1 local_98 [8];
  string configUpper;
  undefined1 local_68 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configsList;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  configsList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)target;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,this->Makefile,IncludeEmptyConfig);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  config = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
  do {
    bVar8 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return;
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
    cmGeneratorTarget::GetSourceFiles
              ((cmGeneratorTarget *)
               configsList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68,
               (string *)
               sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    cmsys::SystemTools::UpperCase
              ((string *)local_98,
               (string *)
               sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    if (AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_ == '\0') {
      iVar9 = __cxa_guard_acquire(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
      if (iVar9 != 0) {
        pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,"C",
                   (allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 1)
                   ,"CXX",(allocator<char> *)
                          ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 2)
                   ,"OBJC",(allocator<char> *)
                           ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 5))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 3)
                   ,"OBJCXX",
                   (allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
        pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        __cxa_atexit(std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                     ::~array,&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
      }
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range3);
    pcVar12 = GetGlobalGenerator(this);
    uVar10 = (*pcVar12->_vptr_cmGlobalGenerator[0x27])();
    if ((uVar10 & 1) != 0) {
      __end3 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
               ::begin(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
      pvVar13 = std::
                array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                ::end(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
      for (; pbVar7 = configsList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
          ppcVar6 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage, __end3 != pvVar13;
          __end3 = __end3 + 1) {
        pchHeader.field_2._8_8_ = __end3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
        cmGeneratorTarget::GetPchHeader
                  ((string *)local_118,(cmGeneratorTarget *)pbVar7,(string *)ppcVar6,__end3,
                   &local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        uVar15 = std::__cxx11::string::empty();
        if ((uVar15 & 1) == 0) {
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::emplace<std::__cxx11::string_const&>
                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&__range3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pchHeader.field_2._8_8_);
        }
        std::__cxx11::string::~string((string *)local_118);
      }
    }
    __end2 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
             ::begin(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
    pvVar13 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              ::end(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
    for (; __end2 != pvVar13; __end2 = __end2 + 1) {
      __first = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                          ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
      __last = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
      std::__cxx11::string::string
                ((string *)
                 &architectures.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)__end2);
      dVar14 = std::
               count_if<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,cmLocalGenerator::AddPchDependencies(cmGeneratorTarget*)::__0>
                         ((__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                           )__first._M_current,
                          (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                           )__last._M_current,
                          (anon_class_32_1_898e3eec_for__M_pred *)
                          &architectures.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      AddPchDependencies(cmGeneratorTarget*)::$_0::~__0
                ((__0 *)&architectures.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (dVar14 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&useMultiArchPch.field_2 + 8));
        pcVar12 = GetGlobalGenerator(this);
        uVar10 = (*pcVar12->_vptr_cmGlobalGenerator[0x27])();
        if ((uVar10 & 1) == 0) {
          cmGeneratorTarget::GetAppleArchs
                    ((cmGeneratorTarget *)
                     configsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)
                     sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&useMultiArchPch.field_2 + 8));
        }
        bVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&useMultiArchPch.field_2 + 8));
        if (bVar8) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&useMultiArchPch.field_2 + 8));
        }
        else {
          std::__cxx11::string::string((string *)&__range4);
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&useMultiArchPch.field_2 + 8);
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar1);
          arch = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar1);
          while( true ) {
            bVar8 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&arch);
            if (!bVar8) break;
            pchHeader_1.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4);
            cmGeneratorTarget::GetPchHeader
                      ((string *)local_220,
                       (cmGeneratorTarget *)
                       configsList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)
                       sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,__end2,
                       (string *)pchHeader_1.field_2._8_8_);
            uVar15 = std::__cxx11::string::empty();
            if ((uVar15 & 1) == 0) {
              cmAlphaNum::cmAlphaNum(&local_270,(string *)&__range4);
              cmAlphaNum::cmAlphaNum(&local_2a0,";-Xarch_");
              cmStrCat<std::__cxx11::string,char[10],std::__cxx11::string>
                        (&local_240,&local_270,&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pchHeader_1.field_2._8_8_,(char (*) [10])";-include",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_220);
              std::__cxx11::string::operator=((string *)&__range4,(string *)&local_240);
              std::__cxx11::string::~string((string *)&local_240);
            }
            std::__cxx11::string::~string((string *)local_220);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          uVar15 = std::__cxx11::string::empty();
          if ((uVar15 & 1) == 0) {
            pcVar2 = *(cmTarget **)
                      configsList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            cmAlphaNum::cmAlphaNum(&local_2f0,__end2);
            cmAlphaNum::cmAlphaNum(&local_320,"_COMPILE_OPTIONS_USE_PCH");
            cmStrCat<>(&local_2c0,&local_2f0,&local_320);
            cmAlphaNum::cmAlphaNum(&local_370,"$<$<CONFIG:");
            cmAlphaNum::cmAlphaNum
                      (&local_3a0,
                       (string *)
                       sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
            cmStrCat<char[3],std::__cxx11::string,char[2]>
                      (&local_340,&local_370,&local_3a0,(char (*) [3])">:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range4,(char (*) [2])0xd17249);
            std::optional<cmListFileBacktrace>::optional();
            cmTarget::AppendProperty(pcVar2,&local_2c0,&local_340,&local_3b8,false);
            std::optional<cmListFileBacktrace>::~optional(&local_3b8);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)&local_2c0);
          }
          std::__cxx11::string::~string((string *)&__range4);
        }
        pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&useMultiArchPch.field_2 + 8);
        __end3_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar1);
        arch_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar1);
        while( true ) {
          bVar8 = __gnu_cxx::operator!=
                            (&__end3_1,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&arch_1);
          if (!bVar8) break;
          arch_00 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_1);
          cmGeneratorTarget::GetPchSource
                    ((string *)((long)&pchHeader_2.field_2 + 8),
                     (cmGeneratorTarget *)
                     configsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)
                     sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,__end2,arch_00);
          cmGeneratorTarget::GetPchHeader
                    ((string *)&__range6,
                     (cmGeneratorTarget *)
                     configsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)
                     sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,__end2,arch_00);
          uVar15 = std::__cxx11::string::empty();
          if ((uVar15 & 1) == 0) {
            uVar15 = std::__cxx11::string::empty();
            if ((uVar15 & 1) != 0) goto LAB_003dc8d5;
            pcVar3 = this->Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4c0,"CMAKE_PCH_EXTENSION",
                       (allocator<char> *)((long)&ReuseFrom.Value + 7));
            local_4a0 = cmMakefile::GetDefinition(pcVar3,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&ReuseFrom.Value + 7));
            bVar8 = cmValue::IsEmpty(&local_4a0);
            pbVar7 = configsList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (bVar8) {
              pchExtension.Value._0_4_ = 0xb;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f0,"PRECOMPILE_HEADERS_REUSE_FROM",
                         (allocator<char> *)((long)&pch_sf + 7));
              local_4d0 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pbVar7,&local_4f0);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pch_sf + 7));
              pchFile.field_2._8_8_ =
                   cmMakefile::GetOrCreateSource
                             (this->Makefile,(string *)((long)&pchHeader_2.field_2 + 8),false,Known)
              ;
              pcVar12 = GetGlobalGenerator(this);
              uVar10 = (*pcVar12->_vptr_cmGlobalGenerator[0x27])();
              if ((uVar10 & 1) == 0) {
                bVar8 = cmValue::operator_cast_to_bool(&local_4d0);
                if (!bVar8) {
                  cmGeneratorTarget::AddSource
                            ((cmGeneratorTarget *)
                             configsList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (string *)((long)&pchHeader_2.field_2 + 8),true);
                }
                cmGeneratorTarget::GetPchFile
                          ((string *)local_520,
                           (cmGeneratorTarget *)
                           configsList.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (string *)
                           sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,__end2,arch_00);
                pcVar3 = this->Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_540,"CMAKE_LINK_PCH",&local_541);
                bVar8 = cmMakefile::IsOn(pcVar3,&local_540);
                std::__cxx11::string::~string((string *)&local_540);
                std::allocator<char>::~allocator(&local_541);
                uVar5 = pchFile.field_2._8_8_;
                if (bVar8) {
                  bVar8 = cmValue::operator_cast_to_bool(&local_4d0);
                  uVar5 = pchFile.field_2._8_8_;
                  if (bVar8) {
                    pcVar12 = this->GlobalGenerator;
                    psVar20 = cmValue::operator*[abi_cxx11_(&local_4d0);
                    local_5f8 = cmGlobalGenerator::FindGeneratorTarget(pcVar12,psVar20);
                    pcVar3 = this->Makefile;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_618,"CMAKE_PCH_COPY_COMPILE_PDB",
                               (allocator<char> *)(compilerId.field_2._M_local_buf + 0xf));
                    bVar8 = cmMakefile::IsOn(pcVar3,&local_618);
                    std::__cxx11::string::~string((string *)&local_618);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(compilerId.field_2._M_local_buf + 0xf));
                    if (bVar8) {
                      pcVar3 = this->Makefile;
                      cmAlphaNum::cmAlphaNum(&local_690,"CMAKE_");
                      cmAlphaNum::cmAlphaNum
                                ((cmAlphaNum *)((long)&compilerVersion.field_2 + 8),__end2);
                      cmStrCat<char[13]>(&local_660,&local_690,
                                         (cmAlphaNum *)((long)&compilerVersion.field_2 + 8),
                                         (char (*) [13])0xd574bf);
                      psVar20 = cmMakefile::GetSafeDefinition(pcVar3,&local_660);
                      std::__cxx11::string::string((string *)local_640,(string *)psVar20);
                      std::__cxx11::string::~string((string *)&local_660);
                      pcVar3 = this->Makefile;
                      cmAlphaNum::cmAlphaNum(&local_730,"CMAKE_");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&langFlags.field_2 + 8),__end2);
                      cmStrCat<char[18]>(&local_700,&local_730,
                                         (cmAlphaNum *)((long)&langFlags.field_2 + 8),
                                         (char (*) [18])0xd6331e);
                      psVar20 = cmMakefile::GetSafeDefinition(pcVar3,&local_700);
                      std::__cxx11::string::string((string *)local_6e0,(string *)psVar20);
                      std::__cxx11::string::~string((string *)&local_700);
                      pcVar3 = this->Makefile;
                      cmAlphaNum::cmAlphaNum(&local_7d0,"CMAKE_");
                      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_800,__end2);
                      cmStrCat<char[8],std::__cxx11::string>
                                (&local_7a0,&local_7d0,(cmAlphaNum *)local_800,
                                 (char (*) [8])0xd5694d,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_98);
                      psVar20 = cmMakefile::GetSafeDefinition(pcVar3,&local_7a0);
                      std::__cxx11::string::string(local_780,(string *)psVar20);
                      std::__cxx11::string::~string((string *)&local_7a0);
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._39_1_ = 0;
                      msvcDebugInformationFormat.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._38_1_ = 0;
                      GetMSVCDebugFormatName
                                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_830,this,
                                 (string *)
                                 sources.
                                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (cmGeneratorTarget *)
                                 configsList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar8 = std::optional::operator_cast_to_bool((optional *)local_830);
                      if (bVar8) {
                        pbVar17 = std::
                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_830);
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._39_1_ = std::operator==(pbVar17,"EditAndContinue");
                        pbVar17 = std::
                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_830);
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._38_1_ = std::operator==(pbVar17,"ProgramDatabase");
                      }
                      else {
                        lVar18 = std::__cxx11::string::find((char *)local_780,0xd2b7c2);
                        local_f43 = true;
                        if (lVar18 == -1) {
                          lVar18 = std::__cxx11::string::find((char *)local_780,0xd2b7c6);
                          local_f43 = lVar18 != -1;
                        }
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._39_1_ = local_f43;
                        lVar18 = std::__cxx11::string::find((char *)local_780,0xd2b7ca);
                        local_f44 = true;
                        if (lVar18 == -1) {
                          lVar18 = std::__cxx11::string::find((char *)local_780,0xd2b7ce);
                          local_f44 = lVar18 != -1;
                        }
                        msvcDebugInformationFormat.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._38_1_ = local_f44;
                      }
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_830);
                      bVar8 = cmSystemTools::VersionCompare(OP_LESS,(string *)local_6e0,"16.0");
                      local_f46 = false;
                      if (bVar8) {
                        local_f46 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_640,"MSVC");
                      }
                      local_831 = local_f46;
                      pcVar3 = this->Makefile;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_858,"CMAKE_VS_PLATFORM_TOOLSET",&local_859);
                      psVar20 = cmMakefile::GetSafeDefinition(pcVar3,&local_858);
                      bVar8 = std::operator==(psVar20,"v90");
                      std::__cxx11::string::~string((string *)&local_858);
                      std::allocator<char>::~allocator(&local_859);
                      pbVar7 = configsList.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      ppcVar6 = sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (bVar8) {
                        local_831 = false;
                      }
                      if (((msvcDebugInformationFormat.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._39_1_ & 1) == 0) && ((local_831 & 1U) == 0)) {
                        if ((msvcDebugInformationFormat.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._38_1_ & 1) != 0) {
                          psVar20 = cmValue::operator*[abi_cxx11_(&local_4d0);
                          pcVar4 = local_5f8;
                          pchSourceObj.field_2._M_local_buf[0xe] = '\x01';
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_920,".pdb",
                                     (allocator<char> *)(pchSourceObj.field_2._M_local_buf + 0xf));
                          pchSourceObj.field_2._M_local_buf[0xe] = '\0';
                          local_900 = &local_920;
                          local_8f8 = 1;
                          std::
                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)(pchSourceObj.field_2._M_local_buf + 0xd));
                          __l._M_len = local_8f8;
                          __l._M_array = local_900;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector(&local_8f0,__l,
                                   (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(pchSourceObj.field_2._M_local_buf + 0xd));
                          CopyPchCompilePdb(this,(string *)ppcVar6,(cmGeneratorTarget *)pbVar7,
                                            psVar20,pcVar4,&local_8f0);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&local_8f0);
                          std::
                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(pchSourceObj.field_2._M_local_buf + 0xd));
                          local_1030 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_900;
                          do {
                            local_1030 = local_1030 + -1;
                            std::__cxx11::string::~string((string *)local_1030);
                          } while (local_1030 != &local_920);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(pchSourceObj.field_2._M_local_buf + 0xf));
                        }
                      }
                      else {
                        psVar20 = cmValue::operator*[abi_cxx11_(&local_4d0);
                        pcVar4 = local_5f8;
                        local_8d3 = 1;
                        local_8d0 = &local_8c8;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_8c8,".pdb",&local_8d1);
                        local_8d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_8a8;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_8a8,".idb",&local_8d2);
                        local_8d3 = 0;
                        local_888 = &local_8c8;
                        local_880 = 2;
                        std::
                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::allocator(&local_8d4);
                        __l_00._M_len = local_880;
                        __l_00._M_array = local_888;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_878,__l_00,&local_8d4);
                        CopyPchCompilePdb(this,(string *)ppcVar6,(cmGeneratorTarget *)pbVar7,psVar20
                                          ,pcVar4,&local_878);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_878);
                        std::
                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~allocator(&local_8d4);
                        local_fb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_888;
                        do {
                          local_fb8 = local_fb8 + -1;
                          std::__cxx11::string::~string((string *)local_fb8);
                        } while (local_fb8 != &local_8c8);
                        std::allocator<char>::~allocator(&local_8d2);
                        std::allocator<char>::~allocator(&local_8d1);
                      }
                      std::__cxx11::string::~string(local_780);
                      std::__cxx11::string::~string((string *)local_6e0);
                      std::__cxx11::string::~string((string *)local_640);
                    }
                    cmGeneratorTarget::GetPchFileObject
                              ((string *)((long)&linkerProperty.field_2 + 8),local_5f8,
                               (string *)
                               sources.
                               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,__end2,arch_00);
                    TVar11 = cmGeneratorTarget::GetType
                                       ((cmGeneratorTarget *)
                                        configsList.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (TVar11 == OBJECT_LIBRARY) {
                      TVar11 = cmGeneratorTarget::GetType(local_5f8);
                      if (TVar11 == OBJECT_LIBRARY) {
                        pcVar2 = *(cmTarget **)
                                  configsList.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_ae8,"INTERFACE_LINK_LIBRARIES",&local_ae9);
                        cmAlphaNum::cmAlphaNum(&local_b40,"$<$<CONFIG:");
                        cmAlphaNum::cmAlphaNum
                                  (&local_b70,
                                   (string *)
                                   sources.
                                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        cmStrCat<char[15],std::__cxx11::string,char[3]>
                                  (&local_b10,&local_b40,&local_b70,(char (*) [15])">:$<LINK_ONLY:",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&linkerProperty.field_2 + 8),(char (*) [3])0xd2bd1a);
                        std::optional<cmListFileBacktrace>::optional();
                        cmTarget::AppendProperty(pcVar2,&local_ae8,&local_b10,&local_b88,false);
                        std::optional<cmListFileBacktrace>::~optional(&local_b88);
                        std::__cxx11::string::~string((string *)&local_b10);
                        std::__cxx11::string::~string((string *)&local_ae8);
                        std::allocator<char>::~allocator(&local_ae9);
                        cmGeneratorTarget::ClearLinkInterfaceCache
                                  ((cmGeneratorTarget *)
                                   configsList.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_970,"LINK_FLAGS_",&local_971);
                      std::allocator<char>::~allocator(&local_971);
                      TVar11 = cmGeneratorTarget::GetType
                                         ((cmGeneratorTarget *)
                                          configsList.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      if (TVar11 == STATIC_LIBRARY) {
                        std::__cxx11::string::operator=((string *)local_970,"STATIC_LIBRARY_FLAGS_")
                        ;
                      }
                      pcVar2 = *(cmTarget **)
                                configsList.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      cmAlphaNum::cmAlphaNum(&local_9c8,(string *)local_970);
                      cmAlphaNum::cmAlphaNum(&local_9f8,(string *)local_98);
                      cmStrCat<>(&local_998,&local_9c8,&local_9f8);
                      cmAlphaNum::cmAlphaNum(&local_a48," ");
                      source = (string_view)
                               std::__cxx11::string::operator_cast_to_basic_string_view
                                         ((string *)(linkerProperty.field_2._M_local_buf + 8));
                      local_aa8 = source;
                      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                                (&local_a98,&this->super_cmOutputConverter,source,SHELL);
                      cmAlphaNum::cmAlphaNum(&local_a78,&local_a98);
                      cmStrCat<>(&local_a18,&local_a48,&local_a78);
                      std::optional<cmListFileBacktrace>::optional();
                      cmTarget::AppendProperty(pcVar2,&local_998,&local_a18,&local_ac0,true);
                      std::optional<cmListFileBacktrace>::~optional(&local_ac0);
                      std::__cxx11::string::~string((string *)&local_a18);
                      std::__cxx11::string::~string((string *)&local_a98);
                      std::__cxx11::string::~string((string *)&local_998);
                      std::__cxx11::string::~string((string *)local_970);
                    }
                    std::__cxx11::string::~string
                              ((string *)(linkerProperty.field_2._M_local_buf + 8));
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_568,"OBJECT_OUTPUTS",&local_569);
                    cmAlphaNum::cmAlphaNum(&local_5c0,"$<$<CONFIG:");
                    cmAlphaNum::cmAlphaNum
                              ((cmAlphaNum *)&reuseTarget,
                               (string *)
                               sources.
                               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    cmStrCat<char[3],std::__cxx11::string,char[2]>
                              (&local_590,&local_5c0,(cmAlphaNum *)&reuseTarget,(char (*) [3])">:",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_520,(char (*) [2])0xd17249);
                    cmSourceFile::AppendProperty((cmSourceFile *)uVar5,&local_568,&local_590,false);
                    std::__cxx11::string::~string((string *)&local_590);
                    std::__cxx11::string::~string((string *)&local_568);
                    std::allocator<char>::~allocator(&local_569);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_bb0,"PCH_EXTENSION",&local_bb1);
                  cmSourceFile::SetProperty((cmSourceFile *)uVar5,&local_bb0,local_4a0);
                  std::__cxx11::string::~string((string *)&local_bb0);
                  std::allocator<char>::~allocator(&local_bb1);
                }
                err.field_2._8_8_ =
                     cmMakefile::GetOrCreateSource(this->Makefile,(string *)&__range6,false,Known);
                std::__cxx11::string::string((string *)local_be8);
                cmSourceFile::ResolveFullPath
                          ((cmSourceFile *)err.field_2._8_8_,(string *)local_be8,(string *)0x0);
                uVar15 = std::__cxx11::string::empty();
                if ((uVar15 & 1) == 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d60);
                  poVar19 = std::operator<<((ostream *)local_d60,
                                            "Unable to resolve full path of PCH-header \'");
                  poVar19 = std::operator<<(poVar19,(string *)&__range6);
                  poVar19 = std::operator<<(poVar19,"\' assigned to target ");
                  psVar20 = cmGeneratorTarget::GetName_abi_cxx11_
                                      ((cmGeneratorTarget *)
                                       configsList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  poVar19 = std::operator<<(poVar19,(string *)psVar20);
                  std::operator<<(poVar19,", although its path is supposed to be known!");
                  std::__cxx11::ostringstream::str();
                  IssueMessage(this,FATAL_ERROR,&local_d80);
                  std::__cxx11::string::~string((string *)&local_d80);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d60);
                }
                cmGeneratorTarget::AddSource
                          ((cmGeneratorTarget *)
                           configsList.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&__range6,
                           false);
                std::__cxx11::string::~string((string *)local_be8);
                std::__cxx11::string::~string((string *)local_520);
              }
              pchExtension.Value._0_4_ = 0;
            }
          }
          else {
LAB_003dc8d5:
            pcVar12 = GetGlobalGenerator(this);
            uVar10 = (*pcVar12->_vptr_cmGlobalGenerator[0x27])();
            if ((uVar10 & 1) != 0) {
              bVar8 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range3);
              if (!bVar8) {
                __end6 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                    local_68);
                sf = (cmSourceFile *)
                     std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                               ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68)
                ;
                while( true ) {
                  bVar8 = __gnu_cxx::operator!=
                                    (&__end6,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                              *)&sf);
                  if (!bVar8) break;
                  ppcVar16 = __gnu_cxx::
                             __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                             ::operator*(&__end6);
                  sourceLanguage.field_2._8_8_ = *ppcVar16;
                  cmSourceFile::GetLanguage_abi_cxx11_
                            ((string *)local_460,(cmSourceFile *)sourceLanguage.field_2._8_8_);
                  uVar10 = std::__cxx11::string::empty();
                  local_e5a = false;
                  if ((uVar10 & 1) == 0) {
                    local_468._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&__range3,(key_type *)local_460);
                    local_470._M_node =
                         (_Base_ptr)
                         std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range3);
                    local_e5a = std::operator==(&local_468,&local_470);
                  }
                  uVar5 = sourceLanguage.field_2._8_8_;
                  if (local_e5a != false) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_490,"SKIP_PRECOMPILE_HEADERS",
                               (allocator<char> *)((long)&pchExtension.Value + 7));
                    cmSourceFile::SetProperty((cmSourceFile *)uVar5,&local_490,"ON");
                    std::__cxx11::string::~string((string *)&local_490);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)((long)&pchExtension.Value + 7));
                  }
                  std::__cxx11::string::~string((string *)local_460);
                  __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator++(&__end6);
                }
              }
            }
            pchExtension.Value._0_4_ = 0xb;
          }
          std::__cxx11::string::~string((string *)&__range6);
          std::__cxx11::string::~string((string *)(pchHeader_2.field_2._M_local_buf + 8));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3_1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&useMultiArchPch.field_2 + 8));
      }
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3);
    std::__cxx11::string::~string((string *)local_98);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddPchDependencies(cmGeneratorTarget* target)
{
  std::vector<std::string> configsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& config : configsList) {
    // FIXME: Refactor collection of sources to not evaluate object
    // libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, config);

    const std::string configUpper = cmSystemTools::UpperCase(config);
    static const std::array<std::string, 4> langs = { { "C", "CXX", "OBJC",
                                                        "OBJCXX" } };

    std::set<std::string> pchLangSet;
    if (this->GetGlobalGenerator()->IsXcode()) {
      for (const std::string& lang : langs) {
        const std::string pchHeader = target->GetPchHeader(config, lang, "");
        if (!pchHeader.empty()) {
          pchLangSet.emplace(lang);
        }
      }
    }

    for (const std::string& lang : langs) {
      auto langSources = std::count_if(
        sources.begin(), sources.end(), [lang](cmSourceFile* sf) {
          return lang == sf->GetLanguage() &&
            !sf->GetProperty("SKIP_PRECOMPILE_HEADERS");
        });
      if (langSources == 0) {
        continue;
      }

      std::vector<std::string> architectures;
      if (!this->GetGlobalGenerator()->IsXcode()) {
        target->GetAppleArchs(config, architectures);
      }
      if (architectures.empty()) {
        architectures.emplace_back();
      } else {
        std::string useMultiArchPch;
        for (const std::string& arch : architectures) {
          const std::string pchHeader =
            target->GetPchHeader(config, lang, arch);
          if (!pchHeader.empty()) {
            useMultiArchPch = cmStrCat(useMultiArchPch, ";-Xarch_", arch,
                                       ";-include", pchHeader);
          }
        }

        if (!useMultiArchPch.empty()) {

          target->Target->AppendProperty(
            cmStrCat(lang, "_COMPILE_OPTIONS_USE_PCH"),
            cmStrCat("$<$<CONFIG:", config, ">:", useMultiArchPch, ">"));
        }
      }

      for (const std::string& arch : architectures) {
        const std::string pchSource = target->GetPchSource(config, lang, arch);
        const std::string pchHeader = target->GetPchHeader(config, lang, arch);

        if (pchSource.empty() || pchHeader.empty()) {
          if (this->GetGlobalGenerator()->IsXcode() && !pchLangSet.empty()) {
            for (auto* sf : sources) {
              const auto sourceLanguage = sf->GetLanguage();
              if (!sourceLanguage.empty() &&
                  pchLangSet.find(sourceLanguage) == pchLangSet.end()) {
                sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
              }
            }
          }
          continue;
        }

        cmValue pchExtension =
          this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

        if (pchExtension.IsEmpty()) {
          continue;
        }

        cmValue ReuseFrom =
          target->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

        auto* pch_sf = this->Makefile->GetOrCreateSource(
          pchSource, false, cmSourceFileLocationKind::Known);

        if (!this->GetGlobalGenerator()->IsXcode()) {
          if (!ReuseFrom) {
            target->AddSource(pchSource, true);
          }

          const std::string pchFile = target->GetPchFile(config, lang, arch);

          // Exclude the pch files from linking
          if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
            if (!ReuseFrom) {
              pch_sf->AppendProperty(
                "OBJECT_OUTPUTS",
                cmStrCat("$<$<CONFIG:", config, ">:", pchFile, ">"));
            } else {
              auto* reuseTarget =
                this->GlobalGenerator->FindGeneratorTarget(*ReuseFrom);

              if (this->Makefile->IsOn("CMAKE_PCH_COPY_COMPILE_PDB")) {

                const std::string compilerId =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

                const std::string compilerVersion =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"));

                const std::string langFlags =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_FLAGS_", configUpper));

                bool editAndContinueDebugInfo = false;
                bool programDatabaseDebugInfo = false;
                if (cm::optional<std::string> msvcDebugInformationFormat =
                      this->GetMSVCDebugFormatName(config, target)) {
                  editAndContinueDebugInfo =
                    *msvcDebugInformationFormat == "EditAndContinue";
                  programDatabaseDebugInfo =
                    *msvcDebugInformationFormat == "ProgramDatabase";
                } else {
                  editAndContinueDebugInfo =
                    langFlags.find("/ZI") != std::string::npos ||
                    langFlags.find("-ZI") != std::string::npos;
                  programDatabaseDebugInfo =
                    langFlags.find("/Zi") != std::string::npos ||
                    langFlags.find("-Zi") != std::string::npos;
                }

                // MSVC 2008 is producing both .pdb and .idb files with /Zi.
                bool msvc2008OrLess =
                  cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                                compilerVersion, "16.0") &&
                  compilerId == "MSVC";
                // but not when used via toolset -Tv90
                if (this->Makefile->GetSafeDefinition(
                      "CMAKE_VS_PLATFORM_TOOLSET") == "v90") {
                  msvc2008OrLess = false;
                }

                if (editAndContinueDebugInfo || msvc2008OrLess) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb", ".idb" });
                } else if (programDatabaseDebugInfo) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb" });
                }
              }

              // Link to the pch object file
              std::string pchSourceObj =
                reuseTarget->GetPchFileObject(config, lang, arch);

              if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
                std::string linkerProperty = "LINK_FLAGS_";
                if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
                  linkerProperty = "STATIC_LIBRARY_FLAGS_";
                }
                target->Target->AppendProperty(
                  cmStrCat(linkerProperty, configUpper),
                  cmStrCat(" ",
                           this->ConvertToOutputFormat(pchSourceObj, SHELL)),
                  cm::nullopt, true);
              } else if (reuseTarget->GetType() ==
                         cmStateEnums::OBJECT_LIBRARY) {
                // FIXME: This can propagate more than one level, unlike
                // the rest of the object files in an object library.
                // Find another way to do this.
                target->Target->AppendProperty(
                  "INTERFACE_LINK_LIBRARIES",
                  cmStrCat("$<$<CONFIG:", config,
                           ">:$<LINK_ONLY:", pchSourceObj, ">>"));
                // We updated the link interface, so ensure it is recomputed.
                target->ClearLinkInterfaceCache();
              }
            }
          } else {
            pch_sf->SetProperty("PCH_EXTENSION", pchExtension);
          }

          // Add pchHeader to source files, which will
          // be grouped as "Precompile Header File"
          auto* pchHeader_sf = this->Makefile->GetOrCreateSource(
            pchHeader, false, cmSourceFileLocationKind::Known);
          std::string err;
          pchHeader_sf->ResolveFullPath(&err);
          if (!err.empty()) {
            std::ostringstream msg;
            msg << "Unable to resolve full path of PCH-header '" << pchHeader
                << "' assigned to target " << target->GetName()
                << ", although its path is supposed to be known!";
            this->IssueMessage(MessageType::FATAL_ERROR, msg.str());
          }
          target->AddSource(pchHeader);
        }
      }
    }
  }
}